

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O1

bool bssl::ext_alpn_add_clienthello
               (SSL_HANDSHAKE *hs,CBB *out,CBB *out_compressible,ssl_client_hello_type_t type)

{
  SSL *ssl;
  int iVar1;
  bool bVar2;
  CBB proto_list;
  CBB contents;
  CBB local_80;
  CBB local_50;
  
  ssl = hs->ssl;
  if (((hs->config->alpn_client_proto_list).size_ == 0) && (iVar1 = SSL_is_quic(ssl), iVar1 != 0)) {
    ERR_put_error(0x10,0,0x133,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                  ,0x545);
    return false;
  }
  bVar2 = true;
  if (((hs->config->alpn_client_proto_list).size_ != 0) && ((ssl->s3->field_0xdc & 0x10) == 0)) {
    iVar1 = CBB_add_u16(out_compressible,0x10);
    if ((iVar1 != 0) &&
       (((iVar1 = CBB_add_u16_length_prefixed(out_compressible,&local_50), iVar1 != 0 &&
         (iVar1 = CBB_add_u16_length_prefixed(&local_50,&local_80), iVar1 != 0)) &&
        (iVar1 = CBB_add_bytes(&local_80,(hs->config->alpn_client_proto_list).data_,
                               (hs->config->alpn_client_proto_list).size_), iVar1 != 0)))) {
      iVar1 = CBB_flush(out_compressible);
      return iVar1 != 0;
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

static bool ext_alpn_add_clienthello(const SSL_HANDSHAKE *hs, CBB *out,
                                     CBB *out_compressible,
                                     ssl_client_hello_type_t type) {
  const SSL *const ssl = hs->ssl;
  if (hs->config->alpn_client_proto_list.empty() && SSL_is_quic(ssl)) {
    // ALPN MUST be used with QUIC.
    OPENSSL_PUT_ERROR(SSL, SSL_R_NO_APPLICATION_PROTOCOL);
    return false;
  }

  if (hs->config->alpn_client_proto_list.empty() ||
      ssl->s3->initial_handshake_complete) {
    return true;
  }

  CBB contents, proto_list;
  if (!CBB_add_u16(out_compressible,
                   TLSEXT_TYPE_application_layer_protocol_negotiation) ||
      !CBB_add_u16_length_prefixed(out_compressible, &contents) ||
      !CBB_add_u16_length_prefixed(&contents, &proto_list) ||
      !CBB_add_bytes(&proto_list, hs->config->alpn_client_proto_list.data(),
                     hs->config->alpn_client_proto_list.size()) ||
      !CBB_flush(out_compressible)) {
    return false;
  }

  return true;
}